

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_test_driver.h
# Opt level: O0

void __thiscall libaom_test::Encoder::Control(Encoder *this,int ctrl_id,aom_svc_layer_id *arg)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper *this_00;
  undefined8 in_RDX;
  uint in_ESI;
  Encoder *in_RDI;
  AssertHelper *unaff_retaddr;
  AssertionResult gtest_ar;
  aom_codec_err_t res;
  char **in_stack_ffffffffffffff78;
  Message *in_stack_ffffffffffffff80;
  aom_codec_err_t *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  char *in_stack_ffffffffffffffa0;
  Type type;
  AssertHelper *in_stack_ffffffffffffffb0;
  AssertionResult local_30;
  aom_codec_err_t local_1c;
  Encoder *message;
  
  message = in_RDI;
  local_1c = aom_codec_control(&in_RDI->encoder_,(int)(ulong)in_ESI,in_RDX);
  testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),(char *)in_RDI,
             in_stack_ffffffffffffff88,(aom_codec_err_t *)in_stack_ffffffffffffff80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_30);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffffb0);
    pcVar2 = EncoderError(in_RDI);
    type = (Type)((ulong)pcVar2 >> 0x20);
    this_00 = (AssertHelper *)
              testing::Message::operator<<(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    testing::AssertionResult::failure_message((AssertionResult *)0x7ee0f3);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffffb0,type,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
               (char *)in_RDI);
    testing::internal::AssertHelper::operator=(unaff_retaddr,(Message *)message);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x7ee13f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x7ee19f);
  return;
}

Assistant:

void Control(int ctrl_id, struct aom_svc_layer_id *arg) {
    const aom_codec_err_t res = aom_codec_control(&encoder_, ctrl_id, arg);
    ASSERT_EQ(AOM_CODEC_OK, res) << EncoderError();
  }